

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_level_html_actions::module2(module_level_html_actions *this,string *module,int level)

{
  bool bVar1;
  ostream *poVar2;
  bool important;
  int level_local;
  string *module_local;
  module_level_html_actions *this_local;
  
  std::operator<<((ostream *)&std::cout," ");
  bVar1 = false;
  if ((level < 0x3fffffff) && (bVar1 = false, 1 < level)) {
    bVar1 = this->level_ + -1 <= level;
  }
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"<strong>");
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  if (level < 0x3fffffff) {
    poVar2 = std::operator<<((ostream *)&std::cout,"<sup>");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,level);
    std::operator<<(poVar2,"</sup>");
  }
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"</strong>");
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        std::cout << " ";

        bool important = level < unknown_level && level > 1 && level >= level_ - 1;

        if( important )
        {
            std::cout << "<strong>";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "<sup>" << level << "</sup>";
        }

        if( important )
        {
            std::cout << "</strong>";
        }
    }